

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O0

wtree_object wtree_init(wave_object wave,int siglength,int J)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  wtree_object pwVar4;
  wtree_object obj;
  int local_30;
  int nodes;
  int elength;
  int temp2;
  int temp;
  int MaxIter;
  int i;
  int size;
  int J_local;
  int siglength_local;
  wave_object wave_local;
  
  iVar2 = wave->filtlength;
  if (100 < J) {
    printf("\n The Decomposition Iterations Cannot Exceed 100. Exiting \n");
    exit(-1);
  }
  uVar3 = wmaxiter(siglength);
  if ((int)uVar3 < J) {
    printf("\n Error - The Signal Can only be iterated %d times using this wavelet. Exiting\n",
           (ulong)uVar3);
    exit(-1);
  }
  elength = 1;
  local_30 = 0;
  obj._4_4_ = 0;
  for (temp = 0; temp < J; temp = temp + 1) {
    elength = elength * 2;
    obj._4_4_ = elength + obj._4_4_;
    local_30 = (iVar2 + -2) * (elength + -1) + local_30;
  }
  pwVar4 = (wtree_object)
           malloc((long)(siglength * (J + 1) + local_30 + obj._4_4_ + J + 1) * 8 + 0x200);
  pwVar4->outlength = siglength * (J + 1) + local_30;
  strcpy(pwVar4->ext,"sym");
  pwVar4->wave = wave;
  pwVar4->siglength = siglength;
  pwVar4->J = J;
  pwVar4->MaxIter = uVar3;
  strcpy(pwVar4->method,"dwt");
  if (siglength % 2 == 0) {
    pwVar4->even = 1;
  }
  else {
    pwVar4->even = 0;
  }
  pwVar4->cobj = (conv_object)0x0;
  pwVar4->nodes = obj._4_4_;
  pwVar4->cfftset = 0;
  pwVar4->lenlength = J + 2;
  pwVar4->output = (double *)(pwVar4 + 1);
  pwVar4->nodelength =
       (int *)(pwVar4[1].method + (long)(siglength * (J + 1) + local_30) * 8 + -0x10);
  pwVar4->coeflength =
       (int *)(pwVar4[1].method + (long)(siglength * (J + 1) + local_30 + obj._4_4_) * 8 + -0x10);
  for (temp = 0; temp < siglength * (J + 1) + local_30 + obj._4_4_ + J + 1; temp = temp + 1) {
    pcVar1 = pwVar4[1].method + (long)temp * 8 + -0x10;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
  }
  return pwVar4;
}

Assistant:

wtree_object wtree_init(wave_object wave, int siglength,int J) {
    int size,i,MaxIter,temp,temp2,elength,nodes;
	wtree_object obj = NULL;

	size = wave->filtlength;

	if (J > 100) {
		printf("\n The Decomposition Iterations Cannot Exceed 100. Exiting \n");
		exit(-1);
	}


	MaxIter = wmaxiter(siglength);
	if (J > MaxIter) {
		printf("\n Error - The Signal Can only be iterated %d times using this wavelet. Exiting\n", MaxIter);
		exit(-1);
	}
	temp = 1;
	elength = 0;
	nodes = 0;
	for(i = 0; i < J;++i) {
	  temp *= 2;
	  nodes += temp;
	  temp2 = (size - 2) * (temp - 1);
	  elength += temp2;
	}

	obj = (wtree_object)malloc(sizeof(struct wtree_set) + sizeof(double)* (siglength * (J + 1) + elength + nodes + J + 1));
	obj->outlength = siglength * (J + 1) + elength;
	strcpy(obj->ext, "sym");

	obj->wave = wave;
	obj->siglength = siglength;
	obj->J = J;
	obj->MaxIter = MaxIter;
	strcpy(obj->method, "dwt");

	if (siglength % 2 == 0) {
		obj->even = 1;
	}
	else {
		obj->even = 0;
	}

	obj->cobj = NULL;
	obj->nodes = nodes;

	obj->cfftset = 0;
	obj->lenlength = J + 2;
	obj->output = &obj->params[0];
	obj->nodelength = (int*) &obj->params[siglength * (J + 1) + elength];
	obj->coeflength = (int*)&obj->params[siglength * (J + 1) + elength + nodes];

	for (i = 0; i < siglength * (J + 1) + elength + nodes + J + 1; ++i) {
	       obj->params[i] = 0.0;
	}

	//wave_summary(obj->wave);

	return obj;
}